

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

void minimalSwapAndFlipIVar_superFast_lessThen5
               (word *pInOut,int iVar,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  uint uVar2;
  uint iQ;
  int start;
  uint kQ;
  uint lQ;
  int M [2];
  int DifStart4;
  int DifStart0;
  int DifStartMin;
  int DifStart1;
  int in_stack_ffffffffffffff80;
  uint local_64 [3];
  uint *local_58;
  char *local_50;
  word *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_40 = 0;
  local_58 = pCanonPhase;
  local_50 = pCanonPerm;
  uVar1 = minTemp0_fast(pInOut,iVar,nWords,&local_3c);
  local_64[0] = uVar1;
  local_64[1] = minTemp1_fast(pInOut,iVar,nWords,&local_34);
  local_64[2] = local_64[1];
  local_48 = pInOut;
  uVar2 = minTemp2_fast(pInOut,iVar,uVar1,local_64[1],nWords,&local_38);
  if (local_3c == local_34) {
    if (local_38 < local_3c) {
      start = local_3c / 100;
      uVar1 = minTemp3_fast(local_48,iVar,start,local_38 / 100,uVar1 ^ 3,local_64[2] ^ 3,&local_40);
      if (local_38 < local_40) {
        iQ = local_64[uVar1 ^ 1];
        uVar1 = local_64[uVar1];
      }
      else {
        iQ = local_64[uVar2];
        uVar1 = local_64[uVar2 ^ 1];
      }
      kQ = 3 - uVar1;
      lQ = 3 - iQ;
      goto LAB_005d8beb;
    }
  }
  else if (local_38 < local_3c || local_38 < local_34) {
    local_38 = local_38 / 100;
    if (local_34 < local_3c) {
      start = local_3c / 100;
      if (local_3c / 100 < local_38) {
        start = local_38;
      }
      kQ = local_64[2] ^ 3;
      lQ = uVar1 ^ 3;
      iQ = uVar1;
      uVar1 = local_64[2];
    }
    else {
      start = local_34 / 100;
      if (local_34 / 100 < local_38) {
        start = local_38;
      }
      kQ = uVar1 ^ 3;
      lQ = local_64[2] ^ 3;
      iQ = local_64[2];
    }
    goto LAB_005d8beb;
  }
  start = local_38 / 100;
  kQ = 3 - local_64[uVar2 ^ 1];
  lQ = 3 - local_64[uVar2];
  iQ = local_64[uVar2];
  uVar1 = local_64[uVar2 ^ 1];
LAB_005d8beb:
  arrangeQuoters_superFast_lessThen5
            (local_48,start,iQ,uVar1,kQ,lQ,iVar,in_stack_ffffffffffffff80,local_50,local_58);
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_lessThen5(word* pInOut, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin, DifStart4=0;
    int M[2];   
    M[0] = minTemp0_fast(pInOut, iVar, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast(pInOut, iVar, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast(pInOut, iVar, M[0], M[1], nWords, &DifStartMin);
//     printf("\nDifStart0 = %d, DifStart1 = %d, DifStartMin = %d\n",DifStart0, DifStart1, DifStartMin);
//     printf("M[0] = %d, M[1] = %d, min1 = %d\n", M[0], M[1], min1);
    if(DifStart0 != DifStart1)
    {
//         printf("if\n");
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart0/100), M[0], M[1], 3 - M[1], 3 - M[0], iVar, nWords, pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart1/100), M[1], M[0], 3 - M[0], 3 - M[1], iVar, nWords, pCanonPerm, pCanonPhase);
    }
    else
    {
//         printf("else\n");
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast(pInOut, iVar, DifStart0/100, DifStartMin/100, 3-M[0], 3-M[1], &DifStart4);  // no reuse DifStart1 because DifStart1 = DifStart1=0
//             printf("after minTemp3_fast min2 = %d, DifStart4 = %d\n", min2, DifStart4);
            if(DifStart4>DifStartMin)
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], iVar, nWords, pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        }
    }
}